

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  ostream *poVar1;
  int local_18;
  char acStack_12 [2];
  int i;
  char cStack_c;
  char cStack_b;
  char tab [6];
  
  cStack_c = '\0';
  cStack_b = '\0';
  tab[0] = '\0';
  tab[1] = '\0';
  _acStack_12 = 0x6970614e;
  i._2_2_ = 0x73;
  for (local_18 = 0; acStack_12[local_18] != '\0'; local_18 = local_18 + 1) {
    poVar1 = std::operator<<((ostream *)&std::cout,"tab[");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_18);
    poVar1 = std::operator<<(poVar1,"]: ");
    poVar1 = std::operator<<(poVar1,acStack_12[local_18]);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  return 0;
}

Assistant:

int main() {
    
    char tab[]="Napis";

    int i = 0;
    while(tab[i] != '\0') {
        cout << "tab[" << i << "]: " << tab[i] << endl;
        i++;
    }

    return 0;
}